

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void P_GunShot(AActor *mo,bool accurate,PClassActor *pufftype,DAngle *pitch)

{
  int iVar1;
  FName local_4c;
  TAngle<double> local_48;
  TAngle<double> local_40;
  int local_34;
  int damage;
  DAngle angle;
  DAngle *pitch_local;
  PClassActor *pufftype_local;
  bool accurate_local;
  AActor *mo_local;
  
  angle.Degrees = (double)pitch;
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffd0);
  iVar1 = FRandom::operator()(&pr_gunshot);
  local_34 = (iVar1 % 3 + 1) * 5;
  TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffd0,&(mo->Angles).Yaw);
  if (!accurate) {
    iVar1 = FRandom::Random2(&pr_gunshot);
    TAngle<double>::operator+=
              ((TAngle<double> *)&stack0xffffffffffffffd0,(double)iVar1 * 0.02197265625);
  }
  TAngle<double>::TAngle(&local_40,(TAngle<double> *)&stack0xffffffffffffffd0);
  TAngle<double>::TAngle(&local_48,pitch);
  iVar1 = local_34;
  FName::FName(&local_4c,NAME_Hitscan);
  P_LineAttack(mo,&local_40,8192.0,&local_48,iVar1,&local_4c,pufftype,0,(FTranslatedLineTarget *)0x0
               ,(int *)0x0);
  return;
}

Assistant:

void P_GunShot (AActor *mo, bool accurate, PClassActor *pufftype, DAngle pitch)
{
	DAngle 	angle;
	int 		damage;
		
	damage = 5*(pr_gunshot()%3+1);
	angle = mo->Angles.Yaw;

	if (!accurate)
	{
		angle += pr_gunshot.Random2 () * (5.625 / 256);
	}

	P_LineAttack (mo, angle, PLAYERMISSILERANGE, pitch, damage, NAME_Hitscan, pufftype);
}